

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_isvalid.cpp
# Opt level: O0

bool __thiscall ON_Brep::IsValidLoopTopology(ON_Brep *this,int loop_index,ON_TextLog *text_log)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  ON_BrepLoop *pOVar4;
  ON_BrepFace *pOVar5;
  uint *puVar6;
  ON_BrepTrim *pOVar7;
  int *piVar8;
  ON_BrepTrim *trim_1;
  int prev_trim_ti;
  int prev_trim_vi1;
  int first_trim_vi0;
  int first_trim_ti;
  ON_BrepTrim *trim;
  ON_BrepLoop *loop;
  int ti;
  int lti;
  ON_TextLog *text_log_local;
  int loop_index_local;
  ON_Brep *this_local;
  
  if ((loop_index < 0) ||
     (iVar1 = ON_ClassArray<ON_BrepLoop>::Count((ON_ClassArray<ON_BrepLoop> *)&this->m_L),
     iVar1 <= loop_index)) {
    if (text_log != (ON_TextLog *)0x0) {
      uVar2 = ON_ClassArray<ON_BrepLoop>::Count((ON_ClassArray<ON_BrepLoop> *)&this->m_L);
      ON_TextLog::Print(text_log,"brep loop_index = %d (should be >=0 and <%d=brep.m_L.Count() ).\n"
                        ,(ulong)(uint)loop_index,(ulong)uVar2);
    }
    this_local._7_1_ = false;
  }
  else {
    pOVar4 = ON_ClassArray<ON_BrepLoop>::operator[]
                       ((ON_ClassArray<ON_BrepLoop> *)&this->m_L,loop_index);
    if (pOVar4->m_loop_index == loop_index) {
      if (pOVar4->m_brep == this) {
        if ((pOVar4->m_fi < 0) ||
           (iVar1 = pOVar4->m_fi,
           iVar3 = ON_ClassArray<ON_BrepFace>::Count((ON_ClassArray<ON_BrepFace> *)&this->m_F),
           iVar3 <= iVar1)) {
          if (text_log != (ON_TextLog *)0x0) {
            ON_TextLog::Print(text_log,"ON_Brep.m_L[%d].m_fi = %d is not invalid.\n",
                              (ulong)(uint)loop_index,(ulong)(uint)pOVar4->m_fi);
          }
          this_local._7_1_ = false;
        }
        else {
          pOVar5 = ON_ClassArray<ON_BrepFace>::operator[]
                             ((ON_ClassArray<ON_BrepFace> *)&this->m_F,pOVar4->m_fi);
          if (pOVar5->m_face_index == pOVar4->m_fi) {
            iVar1 = ON_SimpleArray<int>::Count(&pOVar4->m_ti);
            if (iVar1 < 1) {
              if (text_log != (ON_TextLog *)0x0) {
                uVar2 = ON_SimpleArray<int>::Count(&pOVar4->m_ti);
                ON_TextLog::Print(text_log,"ON_Brep.m_L[%d].m_ti.Count() = %d  (should be > 0 )\n",
                                  (ulong)(uint)loop_index,(ulong)uVar2);
              }
              this_local._7_1_ = false;
            }
            else {
              for (loop._4_4_ = 0; iVar1 = ON_SimpleArray<int>::Count(&pOVar4->m_ti),
                  (int)loop._4_4_ < iVar1; loop._4_4_ = loop._4_4_ + 1) {
                puVar6 = (uint *)ON_SimpleArray<int>::operator[](&pOVar4->m_ti,loop._4_4_);
                uVar2 = *puVar6;
                if (((int)uVar2 < 0) ||
                   (iVar1 = ON_ClassArray<ON_BrepTrim>::Count
                                      ((ON_ClassArray<ON_BrepTrim> *)&this->m_T),
                   iVar1 <= (int)uVar2)) {
                  if (text_log != (ON_TextLog *)0x0) {
                    ON_TextLog::Print(text_log,"ON_Brep.m_L[%d].m_ti[%d] = %d is not invalid.\n",
                                      (ulong)(uint)loop_index,(ulong)loop._4_4_,(ulong)uVar2);
                  }
                  return false;
                }
                pOVar7 = ON_ClassArray<ON_BrepTrim>::operator[]
                                   ((ON_ClassArray<ON_BrepTrim> *)&this->m_T,uVar2);
                if (pOVar7->m_trim_index != uVar2) {
                  if (text_log != (ON_TextLog *)0x0) {
                    ON_TextLog::Print(text_log,"ON_Brep.m_L[%d].m_ti[%d] = %d is a deleted trim.\n",
                                      (ulong)(uint)loop_index,(ulong)loop._4_4_,(ulong)uVar2);
                  }
                  return false;
                }
                if (pOVar7->m_li != loop_index) {
                  if (text_log != (ON_TextLog *)0x0) {
                    ON_TextLog::Print(text_log,"brep loop m_L[%d] or trim m_T[%d] is not valid.\n",
                                      (ulong)(uint)loop_index,(ulong)uVar2);
                    ON_TextLog::PushIndent(text_log);
                    ON_TextLog::Print(text_log,"loop.m_ti[%d] = %d != %d =trim.m_li\n",
                                      (ulong)loop._4_4_,(ulong)uVar2,(ulong)(uint)pOVar7->m_li);
                    ON_TextLog::PopIndent(text_log);
                  }
                  return false;
                }
              }
              prev_trim_vi1 = -4;
              prev_trim_ti = -3;
              trim_1._4_4_ = 0xfffffffe;
              trim_1._0_4_ = 0xfffffff7;
              for (loop._4_4_ = 0; iVar1 = ON_SimpleArray<int>::Count(&pOVar4->m_ti),
                  (int)loop._4_4_ < iVar1; loop._4_4_ = loop._4_4_ + 1) {
                piVar8 = ON_SimpleArray<int>::operator[](&pOVar4->m_ti,loop._4_4_);
                pOVar7 = ON_ClassArray<ON_BrepTrim>::operator[]
                                   ((ON_ClassArray<ON_BrepTrim> *)&this->m_T,*piVar8);
                if (loop._4_4_ == 0) {
                  piVar8 = ON_SimpleArray<int>::operator[](&pOVar4->m_ti,0);
                  prev_trim_vi1 = *piVar8;
                  prev_trim_ti = pOVar7->m_vi[0];
                }
                else if (trim_1._4_4_ != pOVar7->m_vi[0]) {
                  if (text_log != (ON_TextLog *)0x0) {
                    ON_TextLog::Print(text_log,"brep loop m_L[%d] is not valid.\n",
                                      (ulong)(uint)loop_index);
                    ON_TextLog::PushIndent(text_log);
                    piVar8 = ON_SimpleArray<int>::operator[](&pOVar4->m_ti,loop._4_4_);
                    ON_TextLog::Print(text_log,
                                      "m_T[loop.m_ti[%d]=%d].m_vi[1] = %d != m_T[loop.m_ti[%d]=%d].m_vi[0]=%d.\n"
                                      ,(ulong)(loop._4_4_ - 1),(ulong)(uint)trim_1,
                                      (ulong)trim_1._4_4_,(ulong)loop._4_4_,*piVar8,pOVar7->m_vi[0])
                    ;
                    ON_TextLog::PopIndent(text_log);
                  }
                  return false;
                }
                puVar6 = (uint *)ON_SimpleArray<int>::operator[](&pOVar4->m_ti,loop._4_4_);
                trim_1._0_4_ = *puVar6;
                trim_1._4_4_ = pOVar7->m_vi[1];
              }
              if ((prev_trim_vi1 < 0) || (prev_trim_ti == trim_1._4_4_)) {
                this_local._7_1_ = true;
              }
              else {
                if (text_log != (ON_TextLog *)0x0) {
                  ON_TextLog::Print(text_log,"brep loop m_L[%d] is not valid.\n",
                                    (ulong)(uint)loop_index);
                  ON_TextLog::PushIndent(text_log);
                  iVar1 = ON_SimpleArray<int>::Count(&pOVar4->m_ti);
                  ON_TextLog::Print(text_log,
                                    "m_T[loop.m_ti[%d]=%d].m_vi[1] = %d != m_T[loop.m_ti[0]=%d].m_vi[0]=%d.\n"
                                    ,(ulong)(iVar1 - 1),(ulong)(uint)trim_1,(ulong)trim_1._4_4_,
                                    (ulong)(uint)prev_trim_vi1,prev_trim_ti);
                  ON_TextLog::PopIndent(text_log);
                }
                this_local._7_1_ = false;
              }
            }
          }
          else {
            if (text_log != (ON_TextLog *)0x0) {
              ON_TextLog::Print(text_log,"ON_Brep.m_L[%d].m_fi = %d is a deleted face.\n",
                                (ulong)(uint)loop_index,(ulong)(uint)pOVar4->m_fi);
            }
            this_local._7_1_ = false;
          }
        }
      }
      else {
        if (text_log != (ON_TextLog *)0x0) {
          ON_TextLog::Print(text_log,"brep.m_L[%d] loop is not valid.\n",(ulong)(uint)loop_index);
          ON_TextLog::PushIndent(text_log);
          ON_TextLog::Print(text_log,"loop.m_brep does not point to parent brep\n");
          ON_TextLog::PopIndent(text_log);
        }
        this_local._7_1_ = false;
      }
    }
    else {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,"brep.m_L[%d] loop is not valid.\n",(ulong)(uint)loop_index);
        ON_TextLog::PushIndent(text_log);
        ON_TextLog::Print(text_log,"loop.m_loop_index = %d (should be %d).\n",
                          (ulong)(uint)pOVar4->m_loop_index,(ulong)(uint)loop_index);
        ON_TextLog::PopIndent(text_log);
      }
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool
ON_Brep::IsValidLoopTopology( int loop_index, ON_TextLog* text_log ) const
{
  int lti, ti;

  if ( loop_index < 0 || loop_index >= m_L.Count() )
  {
    if ( text_log )
      text_log->Print("brep loop_index = %d (should be >=0 and <%d=brep.m_L.Count() ).\n",
                      loop_index, m_L.Count());
    return false;
  }
  const ON_BrepLoop& loop = m_L[loop_index];
  if ( loop.m_loop_index != loop_index )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_L[%d] loop is not valid.\n",loop_index);
      text_log->PushIndent();
      text_log->Print("loop.m_loop_index = %d (should be %d).\n",
                       loop.m_loop_index, loop_index );
      text_log->PopIndent();
    }
    return false;
  }
  if ( loop.m_brep != this )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_L[%d] loop is not valid.\n",loop_index);
      text_log->PushIndent();
      text_log->Print("loop.m_brep does not point to parent brep\n");
      text_log->PopIndent();
    }
    return false;
  }

  if ( loop.m_fi < 0 || loop.m_fi >= m_F.Count() )
  {
    if ( text_log )
      text_log->Print("ON_Brep.m_L[%d].m_fi = %d is not invalid.\n",loop_index,loop.m_fi);
    return false;
  }
  if ( m_F[loop.m_fi].m_face_index != loop.m_fi )
  {
    if ( text_log )
      text_log->Print("ON_Brep.m_L[%d].m_fi = %d is a deleted face.\n",loop_index,loop.m_fi);
    return false;
  }
  if ( loop.m_ti.Count() < 1 )
  {
      if ( text_log )
        text_log->Print("ON_Brep.m_L[%d].m_ti.Count() = %d  (should be > 0 )\n",loop_index,loop.m_ti.Count());
      return false;
  }

  for ( lti = 0; lti < loop.m_ti.Count(); lti++ )
  {
    ti = loop.m_ti[lti];
    if ( ti < 0 || ti >= m_T.Count() )
    {
      if ( text_log )
        text_log->Print("ON_Brep.m_L[%d].m_ti[%d] = %d is not invalid.\n",loop_index,lti,ti);
      return false;
    }
    const ON_BrepTrim& trim = m_T[ti];
    if ( trim.m_trim_index != ti )
    {
      if ( text_log )
        text_log->Print("ON_Brep.m_L[%d].m_ti[%d] = %d is a deleted trim.\n",loop_index,lti,ti);
      return false;
    }
    if ( trim.m_li != loop_index )
    {
      if ( text_log )
      {
        text_log->Print("brep loop m_L[%d] or trim m_T[%d] is not valid.\n",loop_index,ti);
        text_log->PushIndent();
        text_log->Print("loop.m_ti[%d] = %d != %d =trim.m_li\n",lti,ti,trim.m_li);
        text_log->PopIndent();
      }
      return false;
    }
  }


  int first_trim_ti = -4;
  int first_trim_vi0 = -3;
  int prev_trim_vi1 = -2;
  int prev_trim_ti=-9;
  for ( lti = 0; lti < loop.m_ti.Count(); lti++ )
  {
    const ON_BrepTrim& trim = m_T[loop.m_ti[lti]];
    if ( 0 == lti )
    {
      first_trim_ti = loop.m_ti[lti];
      first_trim_vi0 = trim.m_vi[0];
    }
    else if ( prev_trim_vi1 != trim.m_vi[0] )
    {
      // 23 May 2003 Dale Lear
      //     Added this test to make sure adjacent trims
      //     in a loop shared vertices.
      if ( text_log )
      {
         text_log->Print("brep loop m_L[%d] is not valid.\n",loop_index);
         text_log->PushIndent();
         text_log->Print("m_T[loop.m_ti[%d]=%d].m_vi[1] = %d != m_T[loop.m_ti[%d]=%d].m_vi[0]=%d.\n",
                          lti-1,prev_trim_ti,prev_trim_vi1,lti,loop.m_ti[lti],trim.m_vi[0]);
         text_log->PopIndent();
      }
      return false;
    }
    prev_trim_ti = loop.m_ti[lti];
    prev_trim_vi1 = trim.m_vi[1];
  }

  if ( first_trim_ti >= 0 && first_trim_vi0 != prev_trim_vi1 )
  {
    // 23 May 2003 Dale Lear
    //     Added this test to make sure adjacent trims
    //     in a loop shared vertices.
    if ( text_log )
    {
       text_log->Print("brep loop m_L[%d] is not valid.\n",loop_index);
       text_log->PushIndent();
       text_log->Print("m_T[loop.m_ti[%d]=%d].m_vi[1] = %d != m_T[loop.m_ti[0]=%d].m_vi[0]=%d.\n",
                        loop.m_ti.Count()-1,prev_trim_ti,prev_trim_vi1,first_trim_ti,first_trim_vi0);
       text_log->PopIndent();
    }
    return false;
  }


  return true;
}